

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

bool __thiscall google::protobuf::util::Status::operator==(Status *this,Status *x)

{
  int *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  undefined1 local_11;
  
  local_11 = false;
  if (*(int *)in_RDI == *in_RSI) {
    local_11 = std::operator==(unaff_retaddr,in_RDI);
  }
  return local_11;
}

Assistant:

bool Status::operator==(const Status& x) const {
  return error_code_ == x.error_code_ &&
      error_message_ == x.error_message_;
}